

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meter.cc
# Opt level: O2

vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
* __thiscall
fasttext::Meter::getPositiveCounts
          (vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           *__return_storage_ptr__,Meter *this,int32_t labelId)

{
  pointer ppVar1;
  pointer ppVar2;
  double dVar3;
  uint64_t falsePositives;
  uint64_t truePositives;
  unsigned_long local_50;
  unsigned_long local_48;
  double local_40;
  _Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_> local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  scoreVsTrue((vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_> *)
              &local_38,this,labelId);
  local_48 = 0;
  local_50 = 0;
  dVar3 = -2.0;
  for (ppVar2 = local_38._M_impl.super__Vector_impl_data._M_finish;
      (ppVar2 != local_38._M_impl.super__Vector_impl_data._M_start && (0.0 <= ppVar2[-1].first));
      ppVar2 = ppVar2 + -1) {
    if ((ppVar2[-1].second != 1.0) || (NAN(ppVar2[-1].second))) {
      local_50 = local_50 + 1;
    }
    else {
      local_48 = local_48 + 1;
    }
    local_40 = (double)ppVar2[-1].first;
    if (((dVar3 != local_40) || (NAN(dVar3) || NAN(local_40))) ||
       (ppVar1 = (__return_storage_ptr__->
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish,
       ppVar1 == (__return_storage_ptr__->
                 super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 )._M_impl.super__Vector_impl_data._M_start)) {
      std::
      vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
      ::emplace_back<unsigned_long&,unsigned_long&>
                ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                  *)__return_storage_ptr__,&local_48,&local_50);
    }
    else {
      ppVar1[-1].first = local_48;
      ppVar1[-1].second = local_50;
    }
    dVar3 = local_40;
  }
  std::_Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::
  ~_Vector_base(&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<uint64_t, uint64_t>> Meter::getPositiveCounts(
    int32_t labelId) const {
  std::vector<std::pair<uint64_t, uint64_t>> positiveCounts;

  const auto& v = scoreVsTrue(labelId);
  uint64_t truePositives = 0;
  uint64_t falsePositives = 0;
  double lastScore = falseNegativeScore - 1.0;

  for (auto it = v.rbegin(); it != v.rend(); ++it) {
    double score = it->first;
    double gold = it->second;
    if (score < 0) { // only reachable recall
      break;
    }
    if (gold == 1.0) {
      truePositives++;
    } else {
      falsePositives++;
    }
    if (score == lastScore && positiveCounts.size()) { // squeeze tied scores
      positiveCounts.back() = {truePositives, falsePositives};
    } else {
      positiveCounts.emplace_back(truePositives, falsePositives);
    }
    lastScore = score;
  }

  return positiveCounts;
}